

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O0

string * __thiscall
cmCryptoHash::HashFile(string *__return_storage_ptr__,cmCryptoHash *this,string *file)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  string *local_20;
  string *file_local;
  cmCryptoHash *this_local;
  
  local_20 = file;
  file_local = (string *)this;
  this_local = (cmCryptoHash *)__return_storage_ptr__;
  ByteHashFile(&local_38,this,file);
  ByteHashToString_abi_cxx11_(__return_storage_ptr__,(cmCryptoHash *)&local_38,hash);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHash::HashFile(const std::string& file)
{
  return ByteHashToString(this->ByteHashFile(file));
}